

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int __thiscall fmt::v5::buffered_file::close(buffered_file *this,int __fd)

{
  int in_EAX;
  system_error *this_00;
  int *piVar1;
  string_view message;
  
  if ((FILE *)this->file_ != (FILE *)0x0) {
    in_EAX = fclose((FILE *)this->file_);
    this->file_ = (FILE *)0x0;
    if (in_EAX != 0) {
      this_00 = (system_error *)__cxa_allocate_exception(0x18);
      piVar1 = __errno_location();
      message.size_ = 0x11;
      message.data_ = "cannot close file";
      system_error::system_error<>(this_00,*piVar1,message);
      __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return in_EAX;
}

Assistant:

void buffered_file::close() {
  if (!file_)
    return;
  int result = FMT_SYSTEM(fclose(file_));
  file_ = FMT_NULL;
  if (result != 0)
    FMT_THROW(system_error(errno, "cannot close file"));
}